

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

int simplify_conj(quest_t *conj,uint32 n_term,uint32 n_phone)

{
  uint32 uVar1;
  undefined4 uVar2;
  int iVar3;
  void *ptr;
  quest_t *pqVar4;
  quest_t *pqVar5;
  int exist_del;
  int *del;
  uint32 j;
  uint32 i;
  uint32 n_phone_local;
  uint32 n_term_local;
  quest_t *conj_local;
  
  if (n_term == 0) {
    __assert_fail("n_term != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                  ,0x249,"int simplify_conj(quest_t *, uint32, uint32)");
  }
  if (n_term == 1) {
    conj_local._4_4_ = 1;
  }
  else {
    ptr = __ckd_calloc__((ulong)n_term,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                         ,0x24e);
    for (del._4_4_ = 0; del._4_4_ < n_term; del._4_4_ = del._4_4_ + 1) {
      for (del._0_4_ = 0; (uint)del < n_term; del._0_4_ = (uint)del + 1) {
        if ((del._4_4_ != (uint)del) &&
           (((*(int *)((long)ptr + (ulong)del._4_4_ * 4) == 0 ||
             (*(int *)((long)ptr + (ulong)(uint)del * 4) == 0)) &&
            (iVar3 = is_subset(conj + del._4_4_,conj + (uint)del,n_phone), iVar3 != 0)))) {
          *(undefined4 *)((long)ptr + (ulong)(uint)del * 4) = 1;
        }
      }
    }
    del._4_4_ = 0;
    for (del._0_4_ = 0; (uint)del < n_term; del._0_4_ = (uint)del + 1) {
      if (*(int *)((long)ptr + (ulong)(uint)del * 4) != 0) {
        do {
          del._0_4_ = (uint)del + 1;
        } while (*(int *)((long)ptr + (ulong)(uint)del * 4) != 0 && (uint)del < n_term);
        if ((uint)del == n_term) break;
      }
      if (del._4_4_ != (uint)del) {
        pqVar4 = conj + del._4_4_;
        pqVar5 = conj + (uint)del;
        uVar1 = pqVar5->neg;
        pqVar4->ctxt = pqVar5->ctxt;
        pqVar4->neg = uVar1;
        uVar2 = *(undefined4 *)&pqVar5->field_0xc;
        pqVar4->pset = pqVar5->pset;
        *(undefined4 *)&pqVar4->field_0xc = uVar2;
        pqVar4->member = pqVar5->member;
        pqVar4->posn = pqVar5->posn;
      }
      del._4_4_ = del._4_4_ + 1;
    }
    ckd_free(ptr);
    conj_local._4_4_ = del._4_4_;
  }
  return conj_local._4_4_;
}

Assistant:

int
simplify_conj(quest_t *conj,
	      uint32 n_term,
	      uint32 n_phone)
{
    uint32 i, j;
    int *del, exist_del = FALSE;

    assert(n_term != 0);

    if (n_term == 1)	/* Only one term; nothing to do */
	return 1;

    del = ckd_calloc(n_term, sizeof(int));

    /* Search for all pairs (i,j) where
     * term_i is a subset of term_j.  Mark
     * all such term_j's for deletion since
     * term_i && term_j == term_i */
    for (i = 0; i < n_term; i++) {
	for (j = 0; j < n_term; j++) {
	    if ((i != j) && (!del[i] || !del[j])) {
		if (is_subset(&conj[i], &conj[j], n_phone)) {
		    /* mark the superset for deletion */
		    del[j] = TRUE;
		    exist_del = TRUE;
		}
	    }
	}
    }

    /* compact the conjunction by removing
     * term_j's that are marked for deletion.
     */
    for (i = 0, j = 0; j < n_term; i++, j++) {
	if (del[j]) {
	    /* move j to the next
	     * non-deleted term (if any) */
	    for (j++; del[j] && (j < n_term); j++);
	    
	    if (j == n_term)
		break;
	}
	if (i != j) {
	    conj[i] = conj[j];
	}
    }

    ckd_free(del);

    return i;	/* return new n_term */
}